

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void smfree(small_alloc *alloc,void *ptr,size_t size)

{
  small_mempool *psVar1;
  slab *slab_00;
  mslab *slab_01;
  mslab *slab;
  slab *slab_1;
  small_mempool *pool;
  size_t size_local;
  void *ptr_local;
  small_alloc *alloc_local;
  
  psVar1 = small_mempool_search(alloc,size);
  if (psVar1 == (small_mempool *)0x0) {
    slab_00 = slab_from_data(ptr);
    slab_put_large(alloc->cache,slab_00);
  }
  else {
    slab_01 = (mslab *)slab_from_ptr(ptr,(psVar1->pool).slab_ptr_mask);
    if (psVar1->waste < (ulong)(slab_01->mempool->objsize - (psVar1->pool).objsize)) {
      __assert_fail("pool->waste >= slab->mempool->objsize - pool->pool.objsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,399,"void smfree(struct small_alloc *, void *, size_t)");
    }
    psVar1->waste = psVar1->waste - (ulong)(slab_01->mempool->objsize - (psVar1->pool).objsize);
    mempool_free_slab(slab_01->mempool,slab_01,ptr);
  }
  return;
}

Assistant:

void
smfree(struct small_alloc *alloc, void *ptr, size_t size)
{
	struct small_mempool *pool = small_mempool_search(alloc, size);
	if (pool == NULL) {
		/* Large allocation by slab_cache */
		struct slab *slab = slab_from_data(ptr);
		slab_put_large(alloc->cache, slab);
		return;
	}

	struct mslab *slab = (struct mslab *)
		slab_from_ptr(ptr, pool->pool.slab_ptr_mask);
	/*
	 * In case this ptr was allocated from other small mempool
	 * reducing waste for current pool (as you remember, waste
	 * in our case is memory loss due to allocation from large pools).
	 */
	assert(pool->waste >= slab->mempool->objsize - pool->pool.objsize);
	pool->waste -= slab->mempool->objsize - pool->pool.objsize;
	/* Regular allocation in mempools */
	mempool_free_slab(slab->mempool, slab, ptr);
}